

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

string * sqlcheck::GetTableName(string *__return_storage_ptr__,string *sql_statement)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_58;
  string table_template;
  
  std::__cxx11::string::string((string *)&table_template,"create table",(allocator *)&rest);
  lVar1 = std::__cxx11::string::find((string *)sql_statement,(ulong)&table_template);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&rest);
  }
  else {
    std::__cxx11::string::substr((ulong)&rest,(ulong)sql_statement);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_58,"^ +| +$|( ) +",0x10);
    std::
    regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
              (&local_78,&rest,&local_58,"$1",0);
    std::__cxx11::string::operator=((string *)&rest,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_58);
    cVar4 = (char)&rest;
    uVar2 = std::__cxx11::string::find(cVar4,0x20);
    uVar3 = std::__cxx11::string::find(cVar4,0x28);
    if (uVar2 < uVar3) {
      std::__cxx11::string::find(cVar4,0x20);
      std::__cxx11::string::substr((ulong)&local_78,(ulong)&rest);
    }
    else {
      std::__cxx11::string::find(cVar4,0x28);
      std::__cxx11::string::substr((ulong)&local_78,(ulong)&rest);
    }
    std::__cxx11::string::operator=((string *)&rest,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&rest);
    std::__cxx11::string::~string((string *)&rest);
  }
  std::__cxx11::string::~string((string *)&table_template);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTableName(const std::string& sql_statement){
  std::string table_template = "create table";
  std::size_t found = sql_statement.find(table_template);
  if (found == std::string::npos) {
    return "";
  }

  // Locate table name
  auto rest = sql_statement.substr(found + table_template.size());
  // Strip space at beginning
  rest = std::regex_replace(rest, std::regex("^ +| +$|( ) +"), "$1");
  // check if space or ( comes first in remaining string
  if (rest.find(' ') < rest.find('(')) {
    // space comes first
    rest = rest.substr(0, rest.find(' '));
  } else {
    // ( comes first
    rest = rest.substr(0, rest.find('('));
  }
  auto table_name = rest;

  return table_name;
}